

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O1

void perf_get_msurf_descriptors
               (_func_void_integral_image_ptr_vector<interest_point,_std::allocator<interest_point>_>_ptr
                *function,integral_image *iimage,
               vector<interest_point,_std::allocator<interest_point>_> *ipoints,benchmark_data *data
               )

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  double *pdVar5;
  double *pdVar6;
  benchmark_data *pbVar7;
  size_t j;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_ZMM2 [64];
  double cycles;
  vector<double,_std::allocator<double>_> cycleslist;
  long local_70;
  double local_68;
  double local_60;
  double *local_58;
  double *pdStack_50;
  double *local_48;
  double local_40;
  benchmark_data *local_38;
  
  local_68 = 0.0;
  local_70 = 1;
  dVar11 = 1.0;
  local_38 = data;
  do {
    local_70 = (long)(dVar11 * (double)local_70);
    cpuid_basic_info(0);
    uVar1 = rdtsc();
    for (lVar8 = local_70; lVar8 != 0; lVar8 = lVar8 + -1) {
      (*function)(iimage,ipoints);
    }
    uVar2 = rdtsc();
    cpuid_basic_info(0);
    auVar10 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                 (((ulong)(uint)-(int)(uVar1 >> 0x20) << 0x20) -
                                 (uVar1 & 0xffffffff)) +
                                 (uVar2 & 0xffffffff) + (uVar2 & 0xffffffff00000000));
    local_68 = auVar10._0_8_;
    dVar11 = 100000000.0 / local_68;
  } while (2.0 < dVar11);
  local_58 = (double *)0x0;
  pdStack_50 = (double *)0x0;
  local_48 = (double *)0x0;
  local_40 = 0.0;
  lVar8 = 0;
  do {
    cpuid_basic_info(0);
    uVar3 = rdtsc();
    local_60 = (double)CONCAT44(local_60._4_4_,(int)uVar3);
    for (lVar9 = local_70; lVar9 != 0; lVar9 = lVar9 + -1) {
      (*function)(iimage,ipoints);
    }
    uVar1 = rdtsc();
    auVar10 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                 (((ulong)(uint)-(int)((ulong)uVar3 >> 0x20) << 0x20) -
                                 ((ulong)local_60 & 0xffffffff)) +
                                 (uVar1 & 0xffffffff) + (uVar1 & 0xffffffff00000000));
    cpuid_basic_info(0);
    auVar4 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                ((long)(ipoints->
                                       super__Vector_base<interest_point,_std::allocator<interest_point>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(ipoints->
                                       super__Vector_base<interest_point,_std::allocator<interest_point>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 2) * local_70 *
                                -0xed7303b5cc0ed73);
    local_68 = auVar10._0_8_ / auVar4._0_8_;
    local_60 = local_68;
    if (pdStack_50 == local_48) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_58,(iterator)pdStack_50,&local_68);
    }
    else {
      *pdStack_50 = local_68;
      pdStack_50 = pdStack_50 + 1;
    }
    pbVar7 = local_38;
    pdVar6 = pdStack_50;
    pdVar5 = local_58;
    local_40 = local_40 + local_60;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 10);
  dVar11 = local_40 / 10.0;
  lVar8 = *(long *)(local_38 + 0x210);
  local_68 = dVar11;
  if (local_58 != pdStack_50) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_58,pdStack_50,(int)LZCOUNT((long)pdStack_50 - (long)local_58 >> 3) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar5,pdVar6);
  }
  auVar12._0_8_ = ((double)lVar8 * 100.0) / dVar11;
  auVar12._8_8_ = 0;
  auVar15._8_8_ = 0x3fdfffffffffffff;
  auVar15._0_8_ = 0x3fdfffffffffffff;
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar10 = vpternlogq_avx512vl(auVar15,auVar12,auVar4,0xf8);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = auVar12._0_8_ + auVar10._0_8_;
  auVar4 = vroundsd_avx(auVar13,auVar13,0xb);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_68;
  auVar10 = vmovhps_avx(auVar14,*local_58);
  auVar10 = vcvttpd2uqq_avx512vl(auVar10);
  auVar10 = vpaddq_avx(auVar10,*(undefined1 (*) [16])(pbVar7 + 0x218));
  *(undefined1 (*) [16])(pbVar7 + 0x218) = auVar10;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = pdStack_50[-1];
  lVar8 = vcvttsd2usi_avx512f(auVar10);
  *(long *)(pbVar7 + 0x228) = *(long *)(pbVar7 + 0x228) + lVar8;
  *(double *)(pbVar7 + 0x230) = auVar4._0_8_ / 100.0 + *(double *)(pbVar7 + 0x230);
  operator_delete(local_58,(long)local_48 - (long)local_58);
  return;
}

Assistant:

void perf_get_msurf_descriptors(void (*function)(struct integral_image *, std::vector<struct interest_point> *),
                               struct integral_image *iimage, std::vector<struct interest_point> *ipoints,
                               struct benchmark_data &data) {
    double cycles = 0.;
    long num_runs = 1;
    double multiplier = 1;
    uint64_t start, end;

#ifdef WARM_UP
    // Warm-up phase: we determine a number of executions that allows
    // the code to be executed for at least CYCLES_REQUIRED cycles.
    // This helps excluding timing overhead when measuring small runtimes.
    do {
        num_runs = num_runs * multiplier;
        start = start_tsc();
        for (size_t i = 0; i < num_runs; i++) {
            (*function)(iimage, ipoints);
        }
        end = stop_tsc(start);

        cycles = (double)end;
        multiplier = (CYCLES_REQUIRED) / (cycles);

    } while (multiplier > 2);
#endif

    std::vector<double> cycleslist;

    // Actual performance measurements repeated REP times.
    // We simply store all results and compute medians during post-processing.
    double total_cycles = 0;
    for (size_t j = 0; j < REP; j++) {
        start = start_tsc();
        for (size_t i = 0; i < num_runs; ++i) {
            (*function)(iimage, ipoints);
        }
        end = stop_tsc(start);

        // get avg cycles per keypoint
        cycles = ((double)end) / (num_runs*ipoints->size());
        total_cycles += cycles;

        cycleslist.push_back(cycles);
    }
    total_cycles /= REP;

    cycles = total_cycles;  // cyclesList.front();
    double flops_per_cycle = round((100.0 * data.num_flops) / cycles) / 100.0;
    std::sort(cycleslist.begin(), cycleslist.end());
    data.avg_cycles += (uint64_t)cycles;
    data.min_cycles += (uint64_t)cycleslist.front();
    data.max_cycles += (uint64_t)cycleslist.back();
    data.flops_per_cycle += flops_per_cycle;
}